

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-multicast-join6.c
# Opt level: O3

void cl_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *buf,sockaddr *addr,uint flags)

{
  int iVar1;
  int64_t eval_b;
  int64_t eval_a;
  
  if (handle == &client || handle == &server) {
    if (flags != 0) goto LAB_001e1304;
    if (nread < 0) goto LAB_001e1311;
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      goto LAB_001e132d;
    }
    if (addr == (sockaddr *)0x0) goto LAB_001e1316;
    addr = (sockaddr *)0x4;
    if (nread != 4) goto LAB_001e131b;
    iVar1 = bcmp("PONG",buf->base,4);
    if (iVar1 == 0) {
      cl_recv_cb_called = cl_recv_cb_called + 1;
      uv_close(handle,close_cb);
      return;
    }
  }
  else {
    cl_recv_cb_cold_7();
LAB_001e1304:
    cl_recv_cb_cold_1();
LAB_001e1311:
    cl_recv_cb_cold_6();
LAB_001e1316:
    cl_recv_cb_cold_4();
LAB_001e131b:
    cl_recv_cb_cold_2();
  }
  cl_recv_cb_cold_3();
LAB_001e132d:
  cl_recv_cb_cold_5();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(addr,0);
  return;
}

Assistant:

static void cl_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* buf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  CHECK_HANDLE(handle);
  ASSERT_OK(flags);

  if (nread < 0) {
    ASSERT(0 && "unexpected error");
  }

  if (nread == 0) {
    /* Returning unused buffer. Don't count towards cl_recv_cb_called */
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_NOT_NULL(addr);
  ASSERT_EQ(4, nread);
  ASSERT(!memcmp("PING", buf->base, nread));

  cl_recv_cb_called++;

  if (cl_recv_cb_called == 2) {
    /* we are done with the server handle, we can close it */
    uv_close((uv_handle_t*) &server, close_cb);
  } else {
    int r;
    char source_addr[64];

    r = uv_ip6_name((const struct sockaddr_in6*)addr, source_addr, sizeof(source_addr));
    ASSERT_OK(r);

    r = uv_udp_set_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, UV_LEAVE_GROUP);
    ASSERT_OK(r);

    r = uv_udp_set_source_membership(&server, MULTICAST_ADDR, INTERFACE_ADDR, source_addr, UV_JOIN_GROUP);
    ASSERT_OK(r);

    r = do_send(&req_ss);
    ASSERT_OK(r);
  }
}